

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_doing(Curl_easy *data,_Bool *dophase_done)

{
  curl_trc_feat *pcVar1;
  CURLcode CVar2;
  char *pcVar3;
  char *fmt;
  
  CVar2 = ftp_multi_statemach(data,dophase_done);
  if (CVar2 == CURLE_OK) {
    if (*dophase_done != true) {
      return CURLE_OK;
    }
    CVar2 = ftp_dophase_done(data,false);
    if (data == (Curl_easy *)0x0) {
      return CVar2;
    }
    if (((data->set).field_0x8cd & 0x10) == 0) {
      return CVar2;
    }
    pcVar1 = (data->state).feat;
    if ((pcVar1 != (curl_trc_feat *)0x0) && (pcVar1->log_level < 1)) {
      return CVar2;
    }
    if (Curl_trc_feat_ftp.log_level < 1) {
      return CVar2;
    }
    if (data->conn == (connectdata *)0x0) {
      pcVar3 = "???";
    }
    else {
      pcVar3 = ftp_state_names[(data->conn->proto).ftpc.state];
    }
    fmt = "[%s] DO phase is complete2";
  }
  else {
    if (data == (Curl_easy *)0x0) {
      return CVar2;
    }
    if (((data->set).field_0x8cd & 0x10) == 0) {
      return CVar2;
    }
    pcVar1 = (data->state).feat;
    if ((pcVar1 != (curl_trc_feat *)0x0) && (pcVar1->log_level < 1)) {
      return CVar2;
    }
    if (Curl_trc_feat_ftp.log_level < 1) {
      return CVar2;
    }
    if (data->conn == (connectdata *)0x0) {
      pcVar3 = "???";
    }
    else {
      pcVar3 = ftp_state_names[(data->conn->proto).ftpc.state];
    }
    fmt = "[%s] DO phase failed";
  }
  Curl_trc_ftp(data,fmt,pcVar3);
  return CVar2;
}

Assistant:

static CURLcode ftp_doing(struct Curl_easy *data,
                          bool *dophase_done)
{
  CURLcode result = ftp_multi_statemach(data, dophase_done);

  if(result)
    CURL_TRC_FTP(data, "[%s] DO phase failed", FTP_DSTATE(data));
  else if(*dophase_done) {
    result = ftp_dophase_done(data, FALSE /* not connected */);

    CURL_TRC_FTP(data, "[%s] DO phase is complete2", FTP_DSTATE(data));
  }
  return result;
}